

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

uint8_t __thiscall Samba::readByte(Samba *this,uint32_t addr)

{
  int iVar1;
  pointer pSVar2;
  SambaError *pSVar3;
  byte local_21 [7];
  uint8_t value;
  uint8_t cmd [13];
  uint32_t addr_local;
  Samba *this_local;
  
  cmd._5_4_ = addr;
  unique0x1000017b = this;
  snprintf((char *)local_21,0xd,"o%08X,4#",(ulong)addr);
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  iVar1 = (*pSVar2->_vptr_SerialPort[6])(pSVar2,local_21,0xc);
  if (iVar1 != 0xc) {
    pSVar3 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar3);
    __cxa_throw(pSVar3,&SambaError::typeinfo,SambaError::~SambaError);
  }
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  iVar1 = (*pSVar2->_vptr_SerialPort[5])(pSVar2,local_21,1);
  if (iVar1 != 1) {
    pSVar3 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar3);
    __cxa_throw(pSVar3,&SambaError::typeinfo,SambaError::~SambaError);
  }
  if ((this->_debug & 1U) != 0) {
    printf("%s(addr=%#x)=%#x\n","readByte",(ulong)(uint)cmd._5_4_,(ulong)local_21[0]);
  }
  return local_21[0];
}

Assistant:

uint8_t
Samba::readByte(uint32_t addr)
{
    uint8_t cmd[13];
    uint8_t value;

    snprintf((char*) cmd, sizeof(cmd), "o%08X,4#", addr);
    if (_port->write(cmd, sizeof(cmd) - 1) != sizeof(cmd) - 1)
        throw SambaError();
    if (_port->read(cmd, sizeof(uint8_t)) != sizeof(uint8_t))
        throw SambaError();

    value = cmd[0];

    if (_debug)
        printf("%s(addr=%#x)=%#x\n", __FUNCTION__, addr, value);

    return value;
}